

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O3

void __thiscall ScriptOperator_operator_1_Test::TestBody(ScriptOperator_operator_1_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ScriptOperator script_op;
  AssertHelper local_80;
  Message local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  string local_60;
  ScriptOperator local_40;
  
  cfd::core::ScriptOperator::ScriptOperator
            (&local_40,(ScriptOperator *)cfd::core::ScriptOperator::OP_1ADD);
  local_78.ss_.ptr_._0_4_ = local_40.data_type_;
  local_80.data_._0_4_ = 0x8b;
  testing::internal::CmpHelperEQ<cfd::core::ScriptType,cfd::core::ScriptType>
            ((internal *)&local_60,"script_op.GetDataType()","ScriptType::kOp1Add",
             (ScriptType *)&local_78,(ScriptType *)&local_80);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,(ScriptType)local_78.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,(ScriptType)local_78.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,(ScriptType)local_78.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToString_abi_cxx11_(&local_60,&local_40);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_78,"script_op.ToString().c_str()","\"OP_1ADD\"",
             (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
             "OP_1ADD");
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
  }
  if (local_78.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::core::ScriptOperator::Equals
                    (&local_40,(ScriptOperator *)cfd::core::ScriptOperator::OP_XOR);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78.ss_.ptr_._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_78,
               (AssertionResult *)"script_op.Equals(ScriptOperator::OP_XOR)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x26,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_1_ =
       (internal)
       cfd::core::ScriptOperator::Equals
                 (&local_40,(ScriptOperator *)cfd::core::ScriptOperator::OP_1ADD);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_78.ss_.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_78,
               (AssertionResult *)"script_op.Equals(ScriptOperator::OP_1ADD)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x27,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::core::ScriptOperator::IsPushOperator(&local_40);
  local_78.ss_.ptr_._0_4_ = CONCAT31(local_78.ss_.ptr_._1_3_,!bVar2);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_78,(AssertionResult *)"script_op.IsPushOperator()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x28,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00686ad0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.text_data_._M_dataplus._M_p != &local_40.text_data_.field_2) {
    operator_delete(local_40.text_data_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(ScriptOperator, operator_1) {
  ScriptOperator script_op = ScriptOperator::OP_1ADD;

  EXPECT_EQ(script_op.GetDataType(), ScriptType::kOp1Add);
  EXPECT_STREQ(script_op.ToString().c_str(), "OP_1ADD");
  EXPECT_FALSE(script_op.Equals(ScriptOperator::OP_XOR));
  EXPECT_TRUE(script_op.Equals(ScriptOperator::OP_1ADD));
  EXPECT_FALSE(script_op.IsPushOperator());
}